

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

int Cbs0_ManPropagate(Cbs0_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Gia_Obj_t **ppGVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  
  do {
    iVar14 = (p->pProp).iHead;
    lVar15 = (long)iVar14;
    uVar5 = (p->pProp).iTail;
    uVar8 = (ulong)uVar5;
    if (iVar14 < (int)uVar5) {
      do {
        uVar5 = (uint)uVar8;
        pGVar12 = (p->pProp).pData[lVar15];
        if (pGVar12 == (Gia_Obj_t *)0x0) break;
        if (((ulong)pGVar12 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x1d4,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        uVar8 = *(ulong *)pGVar12;
        uVar5 = (uint)uVar8;
        if ((uVar5 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs0_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x1d5,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        if ((~uVar5 & 0x9fffffff) != 0) {
          if (((int)uVar5 < 0) || (uVar3 = uVar5 & 0x1fffffff, uVar3 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x1d8,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = *(ulong *)(pGVar12 + -(ulong)uVar3);
          uVar9 = ((uint)(uVar8 >> 0x1d) & 7 ^ (uint)(uVar11 >> 0x3e)) & 1;
          uVar4 = (uint)uVar11;
          if ((uVar11 & 0x40000000) == 0) {
            uVar9 = 2;
          }
          uVar13 = (uint)(uVar8 >> 0x20);
          uVar16 = (uint)*(undefined8 *)(pGVar12 + -(ulong)(uVar13 & 0x1fffffff));
          uVar13 = (uVar13 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar12 + -(ulong)(uVar13 & 0x1fffffff)) >> 0x3e))
                   & 1;
          if ((uVar16 >> 0x1e & 1) == 0) {
            uVar13 = 2;
          }
          if ((uVar5 >> 0x1e & 1) == 0) goto LAB_00716f60;
          if ((uVar8 & 0x4000000000000000) == 0) {
            if (uVar13 != 0 && uVar9 != 0) {
              if ((uVar9 == 1) && (uVar13 == 1)) {
                return 1;
              }
              if ((uVar9 == 1) || (uVar13 == 1)) {
                if ((uVar4 >> 0x1e & 1) == 0) {
                  Cbs0_ManAssign(p,(Gia_Obj_t *)
                                   (((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pGVar12 + -(ulong)uVar3))
                                   ^ 1));
                }
                if ((uVar16 >> 0x1e & 1) == 0) {
                  uVar5 = (uint)(*(ulong *)pGVar12 >> 0x20);
                  pGVar12 = (Gia_Obj_t *)
                            (((ulong)(uVar5 >> 0x1d & 1) |
                             (ulong)(pGVar12 + -(ulong)(uVar5 & 0x1fffffff))) ^ 1);
                  goto LAB_00716cff;
                }
              }
              else {
                if (((uVar4 | uVar16) >> 0x1e & 1) != 0) {
                  __assert_fail("Cbs0_VarIsJust(pVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                                ,0x1f2,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
                }
                iVar14 = (p->pJust).iHead;
                lVar6 = (long)iVar14;
                iVar10 = (p->pJust).iTail;
                if (iVar14 < iVar10) {
                  do {
                    pGVar1 = (p->pJust).pData[lVar6];
                    if (pGVar1 == (Gia_Obj_t *)0x0) break;
                    if (pGVar1 == pGVar12) {
                      __assert_fail("!Cbs0_QueHasNode( &p->pJust, pVar )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                                    ,499,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
                    }
                    lVar6 = lVar6 + 1;
                  } while (iVar10 != lVar6);
                }
                iVar14 = (p->pJust).nSize;
                if ((p->pJust).iTail == iVar14) {
                  (p->pJust).nSize = iVar14 * 2;
                  ppGVar7 = (p->pJust).pData;
                  if (ppGVar7 == (Gia_Obj_t **)0x0) {
                    ppGVar7 = (Gia_Obj_t **)malloc((long)iVar14 << 4);
                  }
                  else {
                    ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,(long)iVar14 << 4);
                  }
                  (p->pJust).pData = ppGVar7;
                }
                iVar14 = (p->pJust).iTail;
                (p->pJust).iTail = iVar14 + 1;
                (p->pJust).pData[iVar14] = pGVar12;
              }
            }
          }
          else {
            if (uVar13 == 0 || uVar9 == 0) {
              return 1;
            }
            if ((uVar4 >> 0x1e & 1) == 0) {
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               ((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pGVar12 + -(ulong)uVar3)));
            }
            if ((uVar16 >> 0x1e & 1) == 0) {
              uVar5 = (uint)(*(ulong *)pGVar12 >> 0x20);
              pGVar12 = (Gia_Obj_t *)
                        ((ulong)(uVar5 >> 0x1d & 1) |
                        (ulong)(pGVar12 + -(ulong)(uVar5 & 0x1fffffff)));
LAB_00716cff:
              Cbs0_ManAssign(p,pGVar12);
            }
          }
        }
        lVar15 = lVar15 + 1;
        uVar5 = (p->pProp).iTail;
        uVar8 = (ulong)(int)uVar5;
      } while (lVar15 < (long)uVar8);
    }
    (p->pProp).iHead = uVar5;
    iVar14 = (p->pJust).iHead;
    iVar10 = (p->pJust).iTail;
    if (iVar14 < iVar10) {
      lVar15 = (long)iVar14;
      ppGVar7 = (p->pJust).pData;
      pGVar12 = ppGVar7[lVar15];
      while (pGVar12 != (Gia_Obj_t *)0x0) {
        lVar15 = lVar15 + 1;
        uVar8 = *(ulong *)pGVar12;
        uVar5 = (uint)uVar8;
        uVar11 = uVar8 & 0x1fffffff;
        bVar2 = uVar11 == 0x1fffffff || (int)uVar5 < 0;
        uVar3 = (uint)(uVar8 >> 0x20);
        if (((bVar2) || ((pGVar12[-uVar11].field_0x3 & 0x40) != 0)) ||
           ((pGVar12[-(ulong)(uVar3 & 0x1fffffff)].field_0x3 & 0x40) != 0)) {
          if (((ulong)pGVar12 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x206,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          if (bVar2) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x207,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          if (uVar5 < 0x40000000) {
            __assert_fail("Cbs0_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x208,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          if ((uVar5 >> 0x1e & 1) == 0) {
LAB_00716f60:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x55,"int Cbs0_VarValue(Gia_Obj_t *)");
          }
          if ((uVar8 & 0x4000000000000000) != 0) {
            __assert_fail("!Cbs0_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x209,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = ((uint)(uVar8 >> 0x1d) & 7 ^
                  (uint)((ulong)*(undefined8 *)(pGVar12 + -uVar11) >> 0x3e)) & 1;
          uVar4 = (uint)*(undefined8 *)(pGVar12 + -uVar11);
          if ((uVar4 >> 0x1e & 1) == 0) {
            uVar9 = 2;
          }
          uVar13 = (uint)*(undefined8 *)(pGVar12 + -(ulong)(uVar3 & 0x1fffffff));
          uVar3 = (uVar3 >> 0x1d ^
                  (uint)((ulong)*(undefined8 *)(pGVar12 + -(ulong)(uVar3 & 0x1fffffff)) >> 0x3e)) &
                  1;
          if ((uVar13 >> 0x1e & 1) == 0) {
            uVar3 = 2;
          }
          if ((uVar9 != 0) && (uVar3 != 0)) {
            if ((uVar9 == 1) && (uVar3 == 1)) {
              return 1;
            }
            if ((uVar9 != 1) && (uVar3 != 1)) {
              __assert_fail("Value0 == 1 || Value1 == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                            ,0x211,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
            }
            if ((uVar4 >> 0x1e & 1) == 0) {
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               (((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pGVar12 + -uVar11)) ^ 1));
            }
            if ((uVar13 >> 0x1e & 1) == 0) {
              uVar5 = (uint)(*(ulong *)pGVar12 >> 0x20);
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               (((ulong)(uVar5 >> 0x1d & 1) |
                                (ulong)(pGVar12 + -(ulong)(uVar5 & 0x1fffffff))) ^ 1));
            }
          }
        }
        else {
          lVar6 = (long)iVar14;
          iVar14 = iVar14 + 1;
          ppGVar7[lVar6] = pGVar12;
        }
        iVar10 = (p->pJust).iTail;
        if (iVar10 <= lVar15) break;
        ppGVar7 = (p->pJust).pData;
        pGVar12 = ppGVar7[lVar15];
      }
    }
    if (iVar14 == iVar10) {
      return 0;
    }
    (p->pJust).iTail = iVar14;
  } while( true );
}

Assistant:

int Cbs0_ManPropagate( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs0_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( Cbs0_ManPropagateOne( p, pVar ) )
                return 1;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs0_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs0_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( Cbs0_ManPropagateTwo( p, pVar ) )
                return 1;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}